

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurvesTests.cpp
# Opt level: O1

void __thiscall agge::tests::ArcCurveTests::ArcPointsAreOnCircle(ArcCurveTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  FailedAssertion *pFVar4;
  int iVar5;
  char *__end;
  double dVar6;
  real_t y;
  real_t x;
  arc a;
  float local_d8;
  float local_d4;
  double local_d0;
  double local_c8;
  string local_c0;
  string local_a0;
  LocationInfo local_80;
  int local_54;
  arc local_50;
  
  arc::arc(&local_50,13.1,-17.2,10.1,0.0,1.5707964,0.05);
  arc::vertex(&local_50,&local_d4,&local_d8);
  local_c8 = (double)CONCAT44(local_c8._4_4_,local_d4);
  local_d0 = (double)CONCAT44(local_d0._4_4_,local_d8);
  iVar3 = arc::vertex(&local_50,&local_d4,&local_d8);
  paVar1 = &local_a0.field_2;
  iVar5 = iVar3;
  if (iVar3 == 2) {
    local_54 = iVar3;
    do {
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x156);
      paVar2 = &local_80.filename.field_2;
      if ((local_c8._0_4_ == local_d4) && (!NAN(local_c8._0_4_) && !NAN(local_d4))) {
        pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Values are equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_80);
        __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_80.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x157);
      if ((local_d0._0_4_ == local_d8) && (!NAN(local_d0._0_4_) && !NAN(local_d8))) {
        pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Values are equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_80);
        __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_80.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      local_c8 = (double)local_d4;
      local_d0 = (double)local_d8;
      local_a0._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
                 ,"");
      ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x158);
      dVar6 = (local_c8 + -13.100000381469727) * (local_c8 + -13.100000381469727) +
              (local_d0 + 17.200000762939453) * (local_d0 + 17.200000762939453);
      if (dVar6 < 0.0) {
        dVar6 = ::sqrt(dVar6);
      }
      else {
        dVar6 = SQRT(dVar6);
      }
      if (0.001 < ABS((dVar6 + -10.100000381469727 + dVar6 + -10.100000381469727) /
                      (dVar6 + 10.100000381469727))) {
        pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
        local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_c0,"Values are not approximately equal!","");
        ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_80);
        __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.filename._M_dataplus._M_p != paVar2) {
        operator_delete(local_80.filename._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != paVar1) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      local_c8 = (double)CONCAT44(local_c8._4_4_,local_d4);
      local_d0 = (double)CONCAT44(local_d0._4_4_,local_d8);
      iVar3 = arc::vertex(&local_50,&local_d4,&local_d8);
      iVar5 = local_54;
    } while (iVar3 == 2);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x15d);
  if (iVar5 != 2) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Value is not \'true\'!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_80);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_80.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_a0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/CurvesTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_80,&local_a0,0x15e);
  if (iVar3 != 0) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_c0,"Values are not equal!","");
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_c0,&local_80);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_80.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  return;
}

Assistant:

test( ArcPointsAreOnCircle )
			{
				// INIT
				bool had_output = false;
				int command;
				real_t x, y, prev_x, prev_y;
				arc a(13.1f, -17.2f, 10.1f, 0.0f * pi, 0.5f * pi);

				a.vertex(&x, &y);
				prev_x = x, prev_y = y;

				// ACT / ASSERT
				while (command = a.vertex(&x, &y), command == path_command_line_to)
				{
					had_output = true;
					assert_not_equal(prev_x, x);
					assert_not_equal(prev_y, y);
					assert_point_on_circle(13.1f, -17.2f, 10.1f, x, y);
					prev_x = x, prev_y = y;
				}

				// ASSERT
				assert_is_true(had_output);
				assert_equal(path_command_stop, command);
			}